

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# work_thread.hpp
# Opt level: O3

void __thiscall
so_5::disp::reuse::work_thread::demand_queue_details::
queue_template_t<so_5::disp::reuse::work_thread::demand_queue_details::with_activity_tracking_impl_t>
::stop_service(queue_template_t<so_5::disp::reuse::work_thread::demand_queue_details::with_activity_tracking_impl_t>
               *this)

{
  lock_t *plVar1;
  
  plVar1 = (this->super_with_activity_tracking_impl_t).super_common_data_t.m_lock._M_t.
           super___uniq_ptr_impl<so_5::disp::mpsc_queue_traits::lock_t,_std::default_delete<so_5::disp::mpsc_queue_traits::lock_t>_>
           ._M_t.
           super__Tuple_impl<0UL,_so_5::disp::mpsc_queue_traits::lock_t_*,_std::default_delete<so_5::disp::mpsc_queue_traits::lock_t>_>
           .super__Head_base<0UL,_so_5::disp::mpsc_queue_traits::lock_t_*,_false>._M_head_impl;
  (*plVar1->_vptr_lock_t[2])(plVar1);
  (this->super_with_activity_tracking_impl_t).super_common_data_t.m_in_service = false;
  if ((this->super_with_activity_tracking_impl_t).super_common_data_t.m_demands.
      super__Deque_base<so_5::execution_demand_t,_std::allocator<so_5::execution_demand_t>_>._M_impl
      .super__Deque_impl_data._M_finish._M_cur ==
      (this->super_with_activity_tracking_impl_t).super_common_data_t.m_demands.
      super__Deque_base<so_5::execution_demand_t,_std::allocator<so_5::execution_demand_t>_>._M_impl
      .super__Deque_impl_data._M_start._M_cur) {
    (*plVar1->_vptr_lock_t[5])(plVar1);
  }
  (*plVar1->_vptr_lock_t[3])(plVar1);
  return;
}

Assistant:

void
	stop_service()
	{
		queue_traits::lock_guard_t lock{ *(this->m_lock) };

		this->m_in_service = false;
		// If the demands queue is empty then someone is waiting
		// for new demands inside pop().
		if( this->m_demands.empty() )
			lock.notify_one();
	}